

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_SubDVertex * __thiscall ON_SubD::VertexFromId(ON_SubD *this,uint vertex_id)

{
  ON_SubDimple *this_00;
  ON_SubDimple *subdimple;
  uint vertex_id_local;
  ON_SubD *this_local;
  
  if (((vertex_id == 0) || (vertex_id == 0xffffffff)) ||
     (this_00 = SubDimple(this), this_00 == (ON_SubDimple *)0x0)) {
    this_local = (ON_SubD *)0x0;
  }
  else {
    this_local = (ON_SubD *)ON_SubDimple::VertexFromId(this_00,vertex_id);
  }
  return (ON_SubDVertex *)this_local;
}

Assistant:

const class ON_SubDVertex* ON_SubD::VertexFromId(
  unsigned int vertex_id
  ) const
{
  for (;;)
  {
    if (0 == vertex_id || ON_UNSET_UINT_INDEX == vertex_id )
      break;
    const ON_SubDimple* subdimple = SubDimple();
    if (nullptr == subdimple)
      break;
    return subdimple->VertexFromId(vertex_id);
  }
  return nullptr;
}